

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torcontrol.cpp
# Opt level: O2

bool __thiscall
TorControlConnection::Command(TorControlConnection *this,string *cmd,ReplyHandlerCB *reply_handler)

{
  long lVar1;
  bool bVar2;
  long lVar3;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (this->b_conn != (bufferevent *)0x0) {
    lVar3 = bufferevent_get_output();
    if (lVar3 != 0) {
      evbuffer_add(lVar3,(cmd->_M_dataplus)._M_p,cmd->_M_string_length);
      evbuffer_add(lVar3,"\r\n",2);
      std::
      deque<std::function<void_(TorControlConnection_&,_const_TorControlReply_&)>,_std::allocator<std::function<void_(TorControlConnection_&,_const_TorControlReply_&)>_>_>
      ::push_back(&this->reply_handlers,reply_handler);
      bVar2 = true;
      goto LAB_0033554c;
    }
  }
  bVar2 = false;
LAB_0033554c:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return bVar2;
  }
  __stack_chk_fail();
}

Assistant:

bool TorControlConnection::Command(const std::string &cmd, const ReplyHandlerCB& reply_handler)
{
    if (!b_conn)
        return false;
    struct evbuffer *buf = bufferevent_get_output(b_conn);
    if (!buf)
        return false;
    evbuffer_add(buf, cmd.data(), cmd.size());
    evbuffer_add(buf, "\r\n", 2);
    reply_handlers.push_back(reply_handler);
    return true;
}